

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O3

bool __thiscall JumpBasic::foldInGuards(JumpBasic *this,Funcdata *fd,JumpTable *jump)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  pointer pGVar4;
  pointer pGVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  
  pGVar4 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar5 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pGVar5 == pGVar4) {
    bVar8 = 0;
  }
  else {
    lVar9 = 0;
    uVar7 = 0;
    bVar8 = 0;
    do {
      lVar2 = *(long *)((long)&pGVar4->cbranch + lVar9);
      if (lVar2 != 0) {
        puVar1 = (undefined8 *)((long)&pGVar4->cbranch + lVar9);
        if ((*(byte *)(lVar2 + 8) & 0x20) == 0) {
          iVar3 = (*(this->super_JumpModel)._vptr_JumpModel[0xf])(this,fd,puVar1,jump);
          bVar8 = bVar8 | (byte)iVar3;
          pGVar4 = (this->selectguards).
                   super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pGVar5 = (this->selectguards).
                   super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          *puVar1 = 0;
        }
      }
      uVar7 = uVar7 + 1;
      uVar6 = ((long)pGVar5 - (long)pGVar4 >> 3) * -0x71c71c71c71c71c7;
      lVar9 = lVar9 + 0x48;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool JumpBasic::foldInGuards(Funcdata *fd,JumpTable *jump)

{ // We now think of the BRANCHIND as encompassing
  // the guard function, so we "disarm" the guard
  // instructions by making the guard condition
  // always false.  If the simplification removes
  // the unusable branches, we are left with only
  // one path through the switch
  bool change = false;
  for(int4 i=0;i<selectguards.size();++i) {
    PcodeOp *cbranch = selectguards[i].getBranch();
    if (cbranch == (PcodeOp *)0) continue; // Already normalized
    if (cbranch->isDead()) {
      selectguards[i].clear();
      continue;
    }
    if (foldInOneGuard(fd,selectguards[i],jump))
      change = true;
  }
  return change;
}